

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

bool __thiscall
embree::SceneGraph::GroupNode::calculateClosed(GroupNode *this,bool group_instancing)

{
  bool *pbVar1;
  pointer pRVar2;
  int iVar3;
  Ref<embree::SceneGraph::Node> *c;
  pointer pRVar4;
  
  if ((this->super_Node).closed == false) {
    (this->super_Node).closed = group_instancing;
    (this->super_Node).hasLightOrCamera = false;
    pRVar2 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar4 = (this->children).
                  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar2; pRVar4 = pRVar4 + 1)
    {
      iVar3 = (*(pRVar4->ptr->super_RefCount)._vptr_RefCount[7])
                        (pRVar4->ptr,(ulong)group_instancing);
      pbVar1 = &(this->super_Node).closed;
      *pbVar1 = (bool)(*pbVar1 & (byte)iVar3);
      pbVar1 = &(this->super_Node).hasLightOrCamera;
      *pbVar1 = (bool)(*pbVar1 | pRVar4->ptr->hasLightOrCamera);
    }
  }
  return (bool)((this->super_Node).indegree == 1 & (this->super_Node).closed);
}

Assistant:

bool SceneGraph::GroupNode::calculateClosed(bool group_instancing)
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      hasLightOrCamera = false;
      for (auto& c : children) {
        closed &= c->calculateClosed(group_instancing);
        hasLightOrCamera |= c->hasLightOrCamera;
      }
    }
    return closed && (indegree == 1);
  }